

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_Mul_Test::TestBody(ECCurveTest_Mul_Test *this)

{
  EC_GROUP *group;
  UniquePtr<EC_POINT> r;
  int iVar1;
  EC_POINT *b;
  BIGNUM *n_00;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  AssertHelper local_78;
  AssertHelper local_70;
  UniquePtr<BIGNUM> n;
  UniquePtr<EC_POINT> result;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<EC_POINT> p;
  
  p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
       EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_point_st_*,_bssl::internal::Deleter>)
       p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
  if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&result);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&n,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,800,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&n,(Message *)&result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&n);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
        result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_002a0f89;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
       EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_point_st_*,_bssl::internal::Deleter>)
       result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
  if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
      result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&n);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c1a43,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x322,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&n);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<bignum_st_*,_bssl::internal::Deleter>)
         n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bignum_st_*,_false>)0x0;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x562cc8,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x324,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
LAB_002a0f4a:
      this_00 = &gtest_ar_.message_;
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = EC_POINT_set_to_infinity
                        ((EC_GROUP *)(this->super_ECCurveTest).group_,
                         (EC_POINT *)
                         p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"EC_POINT_set_to_infinity(group(), p.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x325,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_002a0f4a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = BN_set_word((BIGNUM *)
                          n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,10);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"BN_set_word(n.get(), 10)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x326,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_002a0f4a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pcVar2 = (char *)0x0;
      iVar1 = EC_POINT_mul((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)
                           result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BIGNUM *)0x0,
                           (EC_POINT *)
                           p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                           (BIGNUM *)
                           n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EC_POINT_mul(group(), result.get(), nullptr, p.get(), n.get(), nullptr)","false"
                   ,"true",pcVar2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x32a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_002a0f4a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = EC_POINT_is_at_infinity
                        ((EC_GROUP *)(this->super_ECCurveTest).group_,
                         (EC_POINT *)
                         result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar3 = iVar1 != 0;
      gtest_ar_.success_ = bVar3;
      if (!bVar3) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"EC_POINT_is_at_infinity(group(), result.get())","false",
                   "true",pcVar2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x32b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      b = EC_GROUP_get0_generator((EC_GROUP *)(this->super_ECCurveTest).group_);
      r = result;
      group = (this->super_ECCurveTest).group_;
      n_00 = BN_value_one();
      pcVar2 = (char *)0x0;
      iVar1 = EC_POINT_mul((EC_GROUP *)group,
                           (EC_POINT *)
                           r._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,n_00,
                           (EC_POINT *)
                           p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                           (BIGNUM *)
                           n._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EC_POINT_mul(group(), result.get(), BN_value_one(), p.get(), n.get(), nullptr)",
                   "false","true",pcVar2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x330,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_002a0f4a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.success_ = false;
      gtest_ar_._1_3_ = 0;
      local_78.data_._0_4_ =
           EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                        (EC_POINT *)
                        result._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                        .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,b,(BN_CTX *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"0","EC_POINT_cmp(group(), result.get(), generator, nullptr)"
                 ,(int *)&gtest_ar_,(int *)&local_78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x331,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      this_00 = &gtest_ar.message_;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&n);
  }
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&result);
LAB_002a0f89:
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p);
  return;
}

Assistant:

TEST_P(ECCurveTest, Mul) {
  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  bssl::UniquePtr<EC_POINT> result(EC_POINT_new(group()));
  ASSERT_TRUE(result);
  bssl::UniquePtr<BIGNUM> n(BN_new());
  ASSERT_TRUE(n);
  ASSERT_TRUE(EC_POINT_set_to_infinity(group(), p.get()));
  ASSERT_TRUE(BN_set_word(n.get(), 10));

  // First check that 10×∞ = ∞.
  ASSERT_TRUE(
      EC_POINT_mul(group(), result.get(), nullptr, p.get(), n.get(), nullptr));
  EXPECT_TRUE(EC_POINT_is_at_infinity(group(), result.get()));

  // Now check that 10×∞ + G = G.
  const EC_POINT *generator = EC_GROUP_get0_generator(group());
  ASSERT_TRUE(EC_POINT_mul(group(), result.get(), BN_value_one(), p.get(),
                           n.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), result.get(), generator, nullptr));
}